

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O0

bool is_obj_key(string *v,int *obj,int *gen)

{
  bool bVar1;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  int *local_28;
  int *gen_local;
  int *obj_local;
  string *v_local;
  
  local_28 = gen;
  gen_local = obj;
  obj_local = (int *)v;
  std::__cxx11::string::substr((ulong)&local_48,(ulong)v);
  bVar1 = std::operator!=(&local_48,"obj:");
  std::__cxx11::string::~string((string *)&local_48);
  if (bVar1) {
    v_local._7_1_ = 0;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_78,(ulong)obj_local);
    v_local._7_1_ = is_indirect_object(&local_78,gen_local,local_28);
    std::__cxx11::string::~string((string *)&local_78);
  }
  return (bool)(v_local._7_1_ & 1);
}

Assistant:

static bool
is_obj_key(std::string const& v, int& obj, int& gen)
{
    if (v.substr(0, 4) != "obj:") {
        return false;
    }
    return is_indirect_object(v.substr(4), obj, gen);
}